

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall
client_socket::impl::impl
          (impl *this,epoll *ep,file_descriptor *fd,on_ready_t *on_disconnect,
          on_ready_t *on_read_ready,on_ready_t *on_write_ready)

{
  int fd_00;
  uint32_t events;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->ep = ep;
  file_descriptor::file_descriptor(&this->fd,fd);
  std::function<void_()>::function(&this->on_disconnect,on_disconnect);
  std::function<void_()>::function(&this->on_read_ready,on_read_ready);
  std::function<void_()>::function(&this->on_write_ready,on_write_ready);
  fd_00 = weak_file_descriptor::getfd(&(this->fd).super_weak_file_descriptor);
  events = calculate_flags(this);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/socket.cpp:97:52)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/socket.cpp:97:52)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  sysapi::epoll_registration::epoll_registration(&this->reg,ep,fd_00,events,(callback_t *)&local_50)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  this->destroyed = (bool *)0x0;
  return;
}

Assistant:

client_socket::impl::impl(sysapi::epoll &ep, file_descriptor fd, on_ready_t on_disconnect, on_ready_t on_read_ready, on_ready_t on_write_ready)
    : ep(ep)
    , fd(std::move(fd))
    , on_disconnect(std::move(on_disconnect))
    , on_read_ready(std::move(on_read_ready))
    , on_write_ready(std::move(on_write_ready))
    , reg(ep, this->fd.getfd(), calculate_flags(), [this](uint32_t events) {
        assert((events & ~(EPOLLIN | EPOLLOUT | EPOLLRDHUP | EPOLLERR | EPOLLHUP)) == 0);
        bool is_destroyed = false;
        assert(destroyed == nullptr);
        destroyed = &is_destroyed;
        try
        {
            if ((events & EPOLLRDHUP)
             || (events & EPOLLERR)
             || (events & EPOLLHUP))
            {
                this->on_disconnect();
                if (is_destroyed)
                    return;
            }
            if (events & EPOLLIN)
            {
                this->on_read_ready();
                if (is_destroyed)
                    return;
            }
            if (events & EPOLLOUT)
            {
                this->on_write_ready();
                if (is_destroyed)
                    return;
            }
        }
        catch (...)
        {
            destroyed = nullptr;
            throw;
        }
        destroyed = nullptr;
    })
    , destroyed(nullptr)
{
}